

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Pointer,_(ritobin::Category)8>::from_json
          (ErrorStackOption *__return_storage_ptr__,Pointer *value,json *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  const_iterator cVar4;
  const_reference pvVar5;
  reference json_00;
  reference value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  size_t index;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  json_impl *this;
  const_iterator __begin3;
  const_iterator __end3;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  const_iterator local_80;
  undefined8 local_5f;
  undefined4 local_57;
  undefined2 local_53;
  undefined1 local_51;
  const_iterator local_50;
  
  if (json->m_type == object) {
    cVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::_M_find_tr<char[5],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)(json->m_value).object,(char (*) [5])"name");
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pcVar7 = "json.contains(\"name\")";
    }
    else if ((json->m_type == object) &&
            (cVar4 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     ::_M_find_tr<char[6],void>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                 *)(json->m_value).object,(char (*) [6])"items"),
            (_Rb_tree_header *)cVar4._M_node !=
            &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)json,"name");
      bVar3 = hash_from_json<ritobin::FNV1a>(&value->name,pvVar5);
      if (bVar3) {
        pvVar5 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"items");
        if (pvVar5->m_type == array) {
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)json,"items");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cbegin(&local_80,pvVar5);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cend(&local_50,pvVar5);
          paVar1 = &(__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path.field_2;
          this = (json_impl *)0x0;
          do {
            bVar3 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator==(&local_80,&local_50);
            if (bVar3) {
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
              return __return_storage_ptr__;
            }
            json_00 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*(&local_80);
            value_00 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                                 (&value->items);
            item_from_json(__return_storage_ptr__,value_00,json_00);
            bVar3 = (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged;
            if (bVar3 == true) {
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"items","");
              to_index(&local_c0,&local_a0);
              to_index_abi_cxx11_(&local_e0,this,index);
              uVar8 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                uVar8 = local_c0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar8 < local_e0._M_string_length + local_c0._M_string_length) {
                uVar8 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  uVar8 = local_e0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar8 < local_e0._M_string_length + local_c0._M_string_length)
                goto LAB_00129e3c;
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                   (&local_e0,0,0,local_c0._M_dataplus._M_p,
                                    local_c0._M_string_length);
              }
              else {
LAB_00129e3c:
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_c0,local_e0._M_dataplus._M_p,local_e0._M_string_length);
              }
              local_100._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar2 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p == paVar2) {
                local_100.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
                local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              }
              else {
                local_100.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
              }
              local_100._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar2;
              pbVar6->_M_string_length = 0;
              paVar2->_M_local_buf[0] = '\0';
              ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              uVar8 = local_a0.field_2._M_allocated_capacity;
              _Var9._M_p = local_a0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_00129f38:
                operator_delete(_Var9._M_p,uVar8 + 1);
              }
            }
            else if ((__return_storage_ptr__->
                     super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                     _M_payload.
                     super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                     .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged ==
                     true) {
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
              _Var9._M_p = (__return_storage_ptr__->
                           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                           _M_payload.
                           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                           .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                           _M_payload._M_value.path._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var9._M_p != paVar1) {
                uVar8 = paVar1->_M_allocated_capacity;
                goto LAB_00129f38;
              }
            }
            if (bVar3 != false) {
              return __return_storage_ptr__;
            }
            this = this + 1;
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&local_80);
          } while( true );
        }
        pcVar7 = "json[\"items\"].is_array()";
      }
      else {
        pcVar7 = "hash_from_json(value.name, json[\"name\"])";
      }
    }
    else {
      pcVar7 = "json.contains(\"items\")";
    }
  }
  else {
    pcVar7 = "json.is_object()";
  }
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
       "pointer";
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       pcVar7;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path
           .field_2 + 1) = local_5f;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
       local_57;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
       local_53;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f) =
       local_51;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("name"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(hash_from_json(value.name, json["name"]));
            bin_json_assert(json["items"].is_array());
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back();
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }